

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O0

void __thiscall
tinyjson::json_node::_serialize
          (json_node *this,int indent,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *iter,uint indent_size)

{
  bool bVar1;
  pointer ppVar2;
  reference ppjVar3;
  char *__s;
  size_t sVar4;
  char *c;
  char buf [32];
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  value_type local_2b9;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  value_type local_2a9;
  __normal_iterator<tinyjson::json_node_*const_*,_std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>_>
  local_2a8;
  const_iterator citer_1;
  const_iterator cend_1;
  const_iterator cbegin_1;
  value_type local_281;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  value_type local_271;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  value_type local_261;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  value_type local_251;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  value_type local_241;
  _Self local_240;
  const_iterator citer;
  const_iterator cend;
  const_iterator cbegin;
  value_type local_21d;
  uint local_21c;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbStack_218;
  uint indent_size_local;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *iter_local;
  json_node *pjStack_208;
  int indent_local;
  json_node *this_local;
  value_type local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  char *local_1e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  value_type local_1c1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c0;
  pointer local_1b8;
  json_node *local_1b0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  value_type local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  char *local_188;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  value_type local_169;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_168;
  Storage local_160;
  json_node *local_158;
  string *local_150;
  _List_node_base *local_148;
  string *local_140;
  _List_node_base *local_138;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  value_type local_125;
  int local_124;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bStack_120;
  int i_3;
  value_type local_111;
  ulong local_110;
  size_t size_3;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_100;
  int local_f4;
  json_node *local_f0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  value_type local_dd;
  int local_dc;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bStack_d8;
  int i_2;
  value_type local_c9;
  ulong local_c8;
  size_t size_2;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8;
  int local_ac;
  json_node *local_a8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  value_type local_95;
  int local_94;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bStack_90;
  int i_1;
  value_type local_81;
  ulong local_80;
  size_t size_1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_70;
  int local_64;
  json_node *local_60;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  value_type local_4d;
  int local_4c;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bStack_48;
  int i;
  value_type local_39;
  ulong local_38;
  size_t size;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  int local_1c;
  json_node *local_18;
  string *local_10;
  
  local_21c = indent_size;
  pbStack_218 = iter;
  iter_local._4_4_ = indent;
  pjStack_208 = this;
  switch(this->type) {
  case null_type:
    std::copy<char_const*,std::back_insert_iterator<std::__cxx11::string>>
              (_serialize::n,_serialize::n + 4,
               (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )iter->container);
    break;
  case boolean_type:
    if (((this->storage).bool_val & 1U) == 0) {
      std::copy<char_const*,std::back_insert_iterator<std::__cxx11::string>>
                (_serialize::f,_serialize::f + 5,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )iter->container);
    }
    else {
      std::copy<char_const*,std::back_insert_iterator<std::__cxx11::string>>
                (_serialize::t,_serialize::t + 4,
                 (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )iter->container);
    }
    break;
  case number_type:
    __s = dtoa((char *)&c,(this->storage).num_val);
    sVar4 = strlen(__s);
    std::copy<char_const*,std::back_insert_iterator<std::__cxx11::string>>
              (__s,__s + sVar4,pbStack_218->container);
    break;
  case string_type:
    local_160 = this->storage;
    local_169 = '\"';
    local_168 = iter;
    local_158 = this;
    local_178 = std::
                back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(iter,0);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_178,&local_169);
    local_180._M_current = (char *)std::__cxx11::string::begin();
    local_188 = (char *)std::__cxx11::string::end();
    local_190 = local_168->container;
    local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
                          (local_180,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_188,
                           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_190);
    local_199 = '\"';
    local_1a8 = std::
                back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(local_168,0);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_1a8,&local_199);
    break;
  case array_type:
    local_281 = '[';
    cbegin_1._M_current =
         (json_node **)
         std::
         back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator++(iter,0);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&cbegin_1,&local_281);
    if (iter_local._4_4_ != -1) {
      iter_local._4_4_ = iter_local._4_4_ + 1;
    }
    cend_1 = std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::cbegin
                       ((vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                        (this->storage).str_val);
    citer_1 = std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::cend
                        ((vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                         (this->storage).str_val);
    local_2a8._M_current = cend_1._M_current;
    while (bVar1 = __gnu_cxx::operator!=(&local_2a8,&citer_1), bVar1) {
      bVar1 = __gnu_cxx::operator!=(&local_2a8,&cend_1);
      if (bVar1) {
        local_2a9 = ',';
        local_2b8 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(pbStack_218,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&local_2b8,&local_2a9);
      }
      if (iter_local._4_4_ != -1) {
        local_ac = iter_local._4_4_;
        local_b8 = pbStack_218;
        size_2._4_4_ = local_21c;
        local_c8 = (ulong)(iter_local._4_4_ * local_21c);
        local_c9 = '\n';
        local_a8 = this;
        bStack_d8 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(pbStack_218,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&stack0xffffffffffffff28,&local_c9);
        for (local_dc = 0; (ulong)(long)local_dc < local_c8; local_dc = local_dc + 1) {
          local_dd = ' ';
          local_e8 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(local_b8,0);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&local_e8,&local_dd);
        }
      }
      ppjVar3 = __gnu_cxx::
                __normal_iterator<tinyjson::json_node_*const_*,_std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>_>
                ::operator*(&local_2a8);
      _serialize(*ppjVar3,iter_local._4_4_,pbStack_218,local_21c);
      __gnu_cxx::
      __normal_iterator<tinyjson::json_node_*const_*,_std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>_>
      ::operator++(&local_2a8);
    }
    if (iter_local._4_4_ != -1) {
      iter_local._4_4_ = iter_local._4_4_ + -1;
      bVar1 = std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::empty
                        ((vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                         (this->storage).str_val);
      if (!bVar1) {
        local_f4 = iter_local._4_4_;
        local_100 = pbStack_218;
        size_3._4_4_ = local_21c;
        local_110 = (ulong)(iter_local._4_4_ * local_21c);
        local_111 = '\n';
        local_f0 = this;
        bStack_120 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(pbStack_218,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&stack0xfffffffffffffee0,&local_111);
        for (local_124 = 0; (ulong)(long)local_124 < local_110; local_124 = local_124 + 1) {
          local_125 = ' ';
          local_130 = std::
                      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator++(local_100,0);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&local_130,&local_125);
        }
      }
    }
    local_2b9 = ']';
    local_2c8 = std::
                back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(pbStack_218,0);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_2c8,&local_2b9);
    break;
  case object_type:
    local_21d = '{';
    cbegin._M_node =
         (_List_node_base *)
         std::
         back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator++(iter,0);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&cbegin,&local_21d);
    if (iter_local._4_4_ != -1) {
      iter_local._4_4_ = iter_local._4_4_ + 1;
    }
    local_150 = (this->storage).str_val;
    cend._M_node = (_List_node_base *)
                   std::__cxx11::
                   list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                   ::cbegin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                             *)local_150);
    local_140 = (this->storage).str_val;
    local_148 = cend._M_node;
    citer._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
         ::cend((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                 *)local_140);
    local_240._M_node = cend._M_node;
    local_138 = citer._M_node;
    while (bVar1 = std::operator!=(&local_240,&citer), bVar1) {
      bVar1 = std::operator!=(&local_240,&cend);
      if (bVar1) {
        local_241 = ',';
        local_250 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(pbStack_218,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&local_250,&local_241);
      }
      if (iter_local._4_4_ != -1) {
        local_1c = iter_local._4_4_;
        local_28 = pbStack_218;
        size._4_4_ = local_21c;
        local_38 = (ulong)(iter_local._4_4_ * local_21c);
        local_39 = '\n';
        local_18 = this;
        bStack_48 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(pbStack_218,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&stack0xffffffffffffffb8,&local_39);
        for (local_4c = 0; (ulong)(long)local_4c < local_38; local_4c = local_4c + 1) {
          local_4d = ' ';
          local_58 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(local_28,0);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&local_58,&local_4d);
        }
      }
      local_1b8 = std::
                  _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>
                  ::operator->(&local_240);
      local_1c0 = pbStack_218;
      local_1c1 = '\"';
      local_1b0 = this;
      local_1d0 = std::
                  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(pbStack_218,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_1d0,&local_1c1);
      local_1d8._M_current = (char *)std::__cxx11::string::begin();
      local_1e0 = (char *)std::__cxx11::string::end();
      local_1e8 = local_1c0->container;
      local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
                            (local_1d8,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_1e0,
                             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_1e8);
      local_1f1 = '\"';
      this_local = (json_node *)
                   std::
                   back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(local_1c0,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&this_local,&local_1f1);
      local_251 = ':';
      local_260 = std::
                  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(pbStack_218,0);
      std::
      back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_260,&local_251);
      if (iter_local._4_4_ != -1) {
        local_261 = ' ';
        local_270 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(pbStack_218,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&local_270,&local_261);
      }
      ppVar2 = std::
               _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>
               ::operator->(&local_240);
      _serialize(ppVar2->second,iter_local._4_4_,pbStack_218,local_21c);
      std::
      _List_const_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>
      ::operator++(&local_240);
    }
    if (iter_local._4_4_ != -1) {
      iter_local._4_4_ = iter_local._4_4_ + -1;
      local_10 = (this->storage).str_val;
      bVar1 = std::__cxx11::
              list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
              ::empty((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                       *)local_10);
      if (!bVar1) {
        local_64 = iter_local._4_4_;
        local_70 = pbStack_218;
        size_1._4_4_ = local_21c;
        local_80 = (ulong)(iter_local._4_4_ * local_21c);
        local_81 = '\n';
        local_60 = this;
        bStack_90 = std::
                    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(pbStack_218,0);
        std::
        back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&stack0xffffffffffffff70,&local_81);
        for (local_94 = 0; (ulong)(long)local_94 < local_80; local_94 = local_94 + 1) {
          local_95 = ' ';
          local_a0 = std::
                     back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(local_70,0);
          std::
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&local_a0,&local_95);
        }
      }
    }
    local_271 = '}';
    local_280 = std::
                back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(pbStack_218,0);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_280,&local_271);
  }
  return;
}

Assistant:

void _serialize(int indent, std::back_insert_iterator<string>& iter, unsigned int indent_size) const {
      switch (type) {
        case node_type::string_type:
          serialize_str(*(storage.str_val), iter);
          break;
        case node_type::object_type: {
          iter++ = '{';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.object_val->cbegin();
          auto cend = storage.object_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            serialize_str(citer->first, iter);
            iter++ = ':';
            if (indent != -1) {
              iter++ = ' ';
            }
            citer->second->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.object_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = '}';
          break;
        }
        case node_type::array_type: {
          iter++ = '[';
          if (indent != -1) {
            ++indent;
          }
          auto cbegin = storage.array_val->cbegin();
          auto cend = storage.array_val->cend();
          for (auto citer = cbegin; citer != cend; ++citer) {
            if (citer != cbegin) {
              iter++ = ',';
            }
            if (indent != -1) {
              make_indent(indent, iter, indent_size);
            }
            (*citer)->_serialize(indent, iter, indent_size);
          }
          if (indent != -1) {
            --indent;
            if (!storage.array_val->empty()) {
              make_indent(indent, iter, indent_size);
            }
          }
          iter++ = ']';
          break;
        }
        case node_type::null_type: {
		      static const char* n = "null";
          std::copy(n, n + 4, iter);
          break;
		    }
        case node_type::number_type: {
          char buf[MAX_NUMBER_STRING_SIZE];
          const char* c = dtoa(buf, storage.num_val);
          std::copy(c, c + strlen(c), iter);
          break;
        }
        case node_type::boolean_type: {
		      static const char* t = "true";
          static const char* f = "false";
          if (storage.bool_val) {
            std::copy(t, t + 4, iter);
          } else {
            std::copy(f, f + 5, iter);
          }
          break;
		    }
      }
    }